

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::setup
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this)

{
  double dVar1;
  Data *pDVar2;
  pointer puVar3;
  ProblemGraph *pPVar4;
  pointer puVar5;
  undefined1 auVar6 [16];
  pointer pEVar7;
  mapped_type_conflict *pmVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  value_type_conflict2 vVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  key_type local_50;
  Solution local_48;
  
  auVar6 = _DAT_0013f060;
  pDVar2 = this->data_;
  puVar3 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar4 = pDVar2->problemGraph;
  puVar5 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar5) {
    uVar9 = (long)puVar5 + (-8 - (long)puVar3);
    auVar15._8_4_ = (int)uVar9;
    auVar15._0_8_ = uVar9;
    auVar15._12_4_ = (int)(uVar9 >> 0x20);
    auVar13._0_8_ = uVar9 >> 3;
    auVar13._8_8_ = auVar15._8_8_ >> 3;
    uVar10 = 0;
    auVar13 = auVar13 ^ _DAT_0013f060;
    auVar14 = _DAT_0013f050;
    do {
      auVar15 = auVar14 ^ auVar6;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        puVar3[uVar10] = uVar10;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        puVar3[uVar10 + 1] = uVar10 + 1;
      }
      uVar10 = uVar10 + 2;
      lVar11 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar11 + 2;
    } while (((uVar9 >> 3) + 2 & 0xfffffffffffffffe) != uVar10);
  }
  pEVar7 = (pPVar4->graph_).edges_.
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pPVar4->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data + 8) != pEVar7) {
    lVar11 = 8;
    uVar9 = 0;
    do {
      local_48.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = *(pointer *)((long)pEVar7->vertexIndices_ + lVar11 + -8);
      local_50 = *(key_type *)((long)pEVar7->vertexIndices_ + lVar11);
      dVar1 = (pDVar2->costs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      pmVar8 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[]((this->vertices_).
                            super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            (long)local_48.edge_labels.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&local_50);
      *pmVar8 = *pmVar8 + dVar1;
      pmVar8 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[]((this->vertices_).
                            super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_50,
                            (key_type *)&local_48);
      *pmVar8 = dVar1 + *pmVar8;
      uVar9 = uVar9 + 1;
      pEVar7 = (pPVar4->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar9 < (ulong)((long)*(pointer *)
                                    ((long)&(pPVar4->graph_).edges_.
                                            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - (long)pEVar7 >>
                            4));
  }
  pDVar2 = this->data_;
  getSolution(&local_48,this);
  vVar12 = evaluate<std::vector<double,std::allocator<double>>>
                     (pDVar2->problemGraph,&pDVar2->costs,pDVar2->costBirth,pDVar2->costTermination,
                      &local_48);
  this->objective_ = vVar12;
  if (local_48.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.edge_labels.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void setup()
    {
        const auto& graph = data_.problemGraph.graph();
        const auto& costs = data_.costs;
        std::iota(parents_.begin(), parents_.end(), 0);

        for (size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {

            const auto& v0 = graph.vertexOfEdge(edge, 0);
            const auto& v1 = graph.vertexOfEdge(edge, 1);

            updateEdgeWeight(v0, v1, costs[edge]);
        }
        objective_ = evaluate(data_, getSolution());
    }